

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zzz_monster_test.h
# Opt level: O0

int zzz_MyGame_Example_Any_union_verifier(flatcc_union_verifier_descriptor_t *ud)

{
  flatcc_union_verifier_descriptor_t *ud_local;
  
  switch(ud->type) {
  case '\x01':
    ud_local._4_4_ = flatcc_verify_union_table(ud,zzz_MyGame_Example_Monster_verify_table);
    break;
  case '\x02':
    ud_local._4_4_ =
         flatcc_verify_union_table(ud,zzz_MyGame_Example_TestSimpleTableWithEnum_verify_table);
    break;
  case '\x03':
    ud_local._4_4_ = flatcc_verify_union_table(ud,zzz_MyGame_Example2_Monster_verify_table);
    break;
  case '\x04':
    ud_local._4_4_ = flatcc_verify_union_table(ud,zzz_MyGame_Example_Alt_verify_table);
    break;
  default:
    ud_local._4_4_ = 0;
  }
  return ud_local._4_4_;
}

Assistant:

static int zzz_MyGame_Example_Any_union_verifier(flatcc_union_verifier_descriptor_t *ud)
{
    switch (ud->type) {
    case 1: return flatcc_verify_union_table(ud, zzz_MyGame_Example_Monster_verify_table); /* Monster */
    case 2: return flatcc_verify_union_table(ud, zzz_MyGame_Example_TestSimpleTableWithEnum_verify_table); /* TestSimpleTableWithEnum */
    case 3: return flatcc_verify_union_table(ud, zzz_MyGame_Example2_Monster_verify_table); /* Monster2 */
    case 4: return flatcc_verify_union_table(ud, zzz_MyGame_Example_Alt_verify_table); /* Alt */
    default: return flatcc_verify_ok;
    }
}